

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O1

void __thiscall
SmallArray<CompilerStatistics::Timer,_16U>::grow
          (SmallArray<CompilerStatistics::Timer,_16U> *this,uint newSize)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  Allocator *pAVar3;
  Timer *pTVar4;
  uint uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  int iVar9;
  undefined4 extraout_var;
  Timer *pTVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  
  uVar11 = (this->max >> 1) + this->max;
  uVar5 = newSize + 4;
  if (newSize < uVar11) {
    uVar5 = uVar11;
  }
  pAVar3 = this->allocator;
  if (pAVar3 == (Allocator *)0x0) {
    pTVar10 = (Timer *)(*(code *)NULLC::alloc)(uVar5 * 0x28 + 4);
    if (uVar5 != 0) {
      lVar12 = 0;
      do {
        puVar1 = (undefined8 *)((long)&(pTVar10->outputName).begin + lVar12);
        *puVar1 = 0;
        puVar1[1] = 0;
        puVar1 = (undefined8 *)((long)&(pTVar10->keyName).begin + lVar12);
        *puVar1 = 0;
        puVar1[1] = 0;
        *(undefined4 *)((long)&pTVar10->total + lVar12) = 0;
        lVar12 = lVar12 + 0x28;
      } while ((long)(int)uVar5 * 0x28 != lVar12);
    }
  }
  else {
    iVar9 = (*pAVar3->_vptr_Allocator[2])(pAVar3,(ulong)(uVar5 * 0x28 + 4));
    pTVar10 = (Timer *)CONCAT44(extraout_var,iVar9);
    if (uVar5 != 0) {
      lVar12 = 0;
      do {
        puVar1 = (undefined8 *)((long)&(pTVar10->outputName).begin + lVar12);
        *puVar1 = 0;
        puVar1[1] = 0;
        puVar1 = (undefined8 *)((long)&(pTVar10->keyName).begin + lVar12);
        *puVar1 = 0;
        puVar1[1] = 0;
        *(undefined4 *)((long)&pTVar10->total + lVar12) = 0;
        lVar12 = lVar12 + 0x28;
      } while ((long)(int)uVar5 * 0x28 != lVar12);
    }
  }
  if (this->count != 0) {
    lVar12 = 0;
    uVar13 = 0;
    do {
      pTVar4 = this->data;
      *(undefined4 *)((long)&pTVar10->total + lVar12) =
           *(undefined4 *)((long)&pTVar4->total + lVar12);
      puVar1 = (undefined8 *)((long)&(pTVar4->keyName).begin + lVar12);
      uVar6 = *puVar1;
      uVar7 = puVar1[1];
      puVar1 = (undefined8 *)((long)&(pTVar4->outputName).begin + lVar12);
      uVar8 = puVar1[1];
      puVar2 = (undefined8 *)((long)&(pTVar10->outputName).begin + lVar12);
      *puVar2 = *puVar1;
      puVar2[1] = uVar8;
      puVar1 = (undefined8 *)((long)&(pTVar10->keyName).begin + lVar12);
      *puVar1 = uVar6;
      puVar1[1] = uVar7;
      uVar13 = uVar13 + 1;
      lVar12 = lVar12 + 0x28;
    } while (uVar13 < this->count);
  }
  pTVar4 = this->data;
  if (pTVar4 != this->little) {
    if (this->allocator == (Allocator *)0x0) {
      if (pTVar4 != (Timer *)0x0) {
        (*(code *)NULLC::dealloc)(pTVar4);
      }
    }
    else if (pTVar4 != (Timer *)0x0) {
      (*this->allocator->_vptr_Allocator[3])();
    }
  }
  this->data = pTVar10;
  this->max = uVar5;
  return;
}

Assistant:

void grow(unsigned newSize)
	{
		if(max + (max >> 1) > newSize)
			newSize = max + (max >> 1);
		else
			newSize += 4;

		T* newData = 0;
		
		if(allocator)
			newData = allocator->construct<T>(newSize);
		else
			newData = NULLC::construct<T>(newSize);

		for(unsigned i = 0; i < count; i++)
			newData[i] = data[i];

		if(data != little)
		{
			if(allocator)
				allocator->destruct(data, max);
			else
				NULLC::destruct(data, max);
		}

		data = newData;

		max = newSize;
	}